

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * str_trim(char *ptr)

{
  ushort **ppuVar1;
  bool bVar2;
  size_t local_20;
  size_t len;
  char *ptr_local;
  
  len = (size_t)ptr;
  if (ptr == (char *)0x0) {
    ptr_local = (char *)0x0;
  }
  else {
    while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*(char *)len] & 0x2000) != 0) {
      len = len + 1;
    }
    local_20 = strlen((char *)len);
    if (local_20 != 0) {
      while( true ) {
        local_20 = local_20 - 1;
        bVar2 = false;
        if (local_20 != 0) {
          ppuVar1 = __ctype_b_loc();
          bVar2 = ((*ppuVar1)[(int)*(char *)(len + local_20)] & 0x2000) != 0;
        }
        if (!bVar2) break;
        *(undefined1 *)(len + local_20) = 0;
      }
    }
    ptr_local = (char *)len;
  }
  return ptr_local;
}

Assistant:

char *
str_trim(char *ptr) {
  size_t len;

  if (!ptr) {
    return NULL;
  }

  /* skip leading whitespaces */
  while (isspace(*ptr)) {
    ptr++;
  }

  /* get end of string */
  len = strlen(ptr);
  if (len) {
    /* remove trailing whitespaces */
    while (--len > 0 && isspace(ptr[len])) {
      ptr[len] = 0;
    }
  }
  return ptr;
}